

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O1

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateBatchnormLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  size_type sVar3;
  size_type sVar4;
  size_type sVar5;
  string *psVar6;
  bool bVar7;
  uint uVar8;
  bool bVar9;
  WeightParamType WVar10;
  WeightParams *pWVar11;
  long *plVar12;
  LayerUnion LVar13;
  uint uVar14;
  size_type *psVar15;
  char cVar16;
  bool bVar17;
  bool bVar18;
  Result r;
  string err;
  string local_e8;
  size_type *local_c8;
  _Alloc_hider local_c0;
  size_type local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b0;
  undefined1 local_a0 [8];
  _Alloc_hider local_98;
  undefined1 local_90 [24];
  string local_78;
  uint64 local_58;
  string local_50;
  
  Result::Result((Result *)&local_c8);
  validateInputCount((Result *)local_a0,layer,1,1);
  local_c8 = (size_type *)local_a0;
  std::__cxx11::string::operator=((string *)&local_c0,(string *)&local_98);
  if (local_98._M_p != local_90 + 8) {
    operator_delete(local_98._M_p,local_90._8_8_ + 1);
  }
  bVar9 = Result::good((Result *)&local_c8);
  if (bVar9) {
    validateOutputCount((Result *)local_a0,layer,1,1);
    local_c8 = (size_type *)local_a0;
    std::__cxx11::string::operator=((string *)&local_c0,(string *)&local_98);
    if (local_98._M_p != local_90 + 8) {
      operator_delete(local_98._M_p,local_90._8_8_ + 1);
    }
  }
  bVar9 = Result::good((Result *)&local_c8);
  if (bVar9) {
    if (this->ndArrayInterpretation == true) {
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"Batchnorm","");
      validateInputOutputRankEquality((Result *)local_a0,layer,&local_50,&this->blobNameToRank);
      local_c8 = (size_type *)local_a0;
      std::__cxx11::string::operator=((string *)&local_c0,(string *)&local_98);
      if (local_98._M_p != local_90 + 8) {
        operator_delete(local_98._M_p,local_90._8_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      bVar9 = Result::good((Result *)&local_c8);
      if (bVar9) {
        local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"Batchnorm","");
        validateRankCount((Result *)local_a0,layer,&local_e8,3,-1,&this->blobNameToRank);
        local_c8 = (size_type *)local_a0;
        std::__cxx11::string::operator=((string *)&local_c0,(string *)&local_98);
        if (local_98._M_p != local_90 + 8) {
          operator_delete(local_98._M_p,local_90._8_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
          operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
        }
        bVar9 = Result::good((Result *)&local_c8);
        if (bVar9) goto LAB_0053843c;
      }
    }
    else {
LAB_0053843c:
      if (layer->_oneof_case_[0] == 0xa0) {
        LVar13 = layer->layer_;
      }
      else {
        LVar13.batchnorm_ = Specification::BatchnormLayerParams::default_instance();
      }
      pWVar11 = (WeightParams *)((LVar13.activation_)->NonlinearityType_).relu_;
      if (pWVar11 == (WeightParams *)0x0) {
        pWVar11 = (WeightParams *)&Specification::_WeightParams_default_instance_;
      }
      iVar2 = (pWVar11->floatvalue_).current_size_;
      uVar14 = (0 < iVar2) + 1;
      if (((pWVar11->float16value_).ptr_)->_M_string_length == 0) {
        uVar14 = (uint)(0 < iVar2);
      }
      if ((iVar2 < 1) ||
         (((uVar14 - (((pWVar11->rawvalue_).ptr_)->_M_string_length == 0)) + 2) -
          (uint)(((pWVar11->int8rawvalue_).ptr_)->_M_string_length == 0) != 1)) {
        if (layer->_oneof_case_[0] == 0xa0) {
          LVar13 = layer->layer_;
        }
        else {
          LVar13.batchnorm_ = Specification::BatchnormLayerParams::default_instance();
        }
        pWVar11 = (LVar13.innerproduct_)->bias_;
        if (pWVar11 == (WeightParams *)0x0) {
          pWVar11 = (WeightParams *)&Specification::_WeightParams_default_instance_;
        }
        iVar2 = (pWVar11->floatvalue_).current_size_;
        uVar14 = (0 < iVar2) + 1;
        if (((pWVar11->float16value_).ptr_)->_M_string_length == 0) {
          uVar14 = (uint)(0 < iVar2);
        }
        if ((0 < iVar2) &&
           (((uVar14 - (((pWVar11->rawvalue_).ptr_)->_M_string_length == 0)) + 2) -
            (uint)(((pWVar11->int8rawvalue_).ptr_)->_M_string_length == 0) == 1)) goto LAB_0053857a;
        if (layer->_oneof_case_[0] == 0xa0) {
          LVar13 = layer->layer_;
        }
        else {
          LVar13.batchnorm_ = Specification::BatchnormLayerParams::default_instance();
        }
        pWVar11 = (LVar13.batchnorm_)->mean_;
        if (pWVar11 == (WeightParams *)0x0) {
          pWVar11 = (WeightParams *)&Specification::_WeightParams_default_instance_;
        }
        iVar2 = (pWVar11->floatvalue_).current_size_;
        uVar14 = (0 < iVar2) + 1;
        if (((pWVar11->float16value_).ptr_)->_M_string_length == 0) {
          uVar14 = (uint)(0 < iVar2);
        }
        if ((0 < iVar2) &&
           (((uVar14 - (((pWVar11->rawvalue_).ptr_)->_M_string_length == 0)) + 2) -
            (uint)(((pWVar11->int8rawvalue_).ptr_)->_M_string_length == 0) == 1)) goto LAB_0053857a;
        if (layer->_oneof_case_[0] == 0xa0) {
          LVar13 = layer->layer_;
        }
        else {
          LVar13.batchnorm_ = Specification::BatchnormLayerParams::default_instance();
        }
        pWVar11 = (LVar13.batchnorm_)->variance_;
        if (pWVar11 == (WeightParams *)0x0) {
          pWVar11 = (WeightParams *)&Specification::_WeightParams_default_instance_;
        }
        iVar2 = (pWVar11->floatvalue_).current_size_;
        uVar14 = (0 < iVar2) + 1;
        if (((pWVar11->float16value_).ptr_)->_M_string_length == 0) {
          uVar14 = (uint)(0 < iVar2);
        }
        uVar8 = (uint)(((pWVar11->int8rawvalue_).ptr_)->_M_string_length == 0);
        uVar14 = (uVar14 - (((pWVar11->rawvalue_).ptr_)->_M_string_length == 0)) + 2;
        bVar9 = true;
        if (uVar14 - uVar8 < 2) {
          bVar9 = uVar14 == uVar8 || iVar2 < 1;
        }
      }
      else {
LAB_0053857a:
        bVar9 = false;
      }
      if (layer->_oneof_case_[0] == 0xa0) {
        LVar13 = layer->layer_;
      }
      else {
        LVar13.batchnorm_ = Specification::BatchnormLayerParams::default_instance();
      }
      pWVar11 = (WeightParams *)((LVar13.activation_)->NonlinearityType_).relu_;
      if (pWVar11 == (WeightParams *)0x0) {
        pWVar11 = (WeightParams *)&Specification::_WeightParams_default_instance_;
      }
      iVar2 = (pWVar11->floatvalue_).current_size_;
      sVar3 = ((pWVar11->float16value_).ptr_)->_M_string_length;
      uVar14 = (0 < iVar2) + 1;
      if (sVar3 == 0) {
        uVar14 = (uint)(0 < iVar2);
      }
      sVar4 = ((pWVar11->rawvalue_).ptr_)->_M_string_length;
      sVar5 = ((pWVar11->int8rawvalue_).ptr_)->_M_string_length;
      uVar8 = (uint)(sVar5 == 0);
      uVar14 = (uVar14 - (sVar4 == 0)) + 2;
      cVar16 = '\x04';
      if (uVar14 - uVar8 < 2) {
        cVar16 = '\x05';
        if (uVar14 != uVar8) {
          cVar16 = iVar2 < 1;
        }
        if (((((sVar3 == 0) && (iVar2 < 1)) && (uVar14 != uVar8)) &&
            (((sVar4 == 0 ||
              (pWVar11 == (WeightParams *)&Specification::_WeightParams_default_instance_)) ||
             (cVar16 = '\x02', pWVar11->quantization_ == (QuantizationParams *)0x0)))) &&
           (((sVar5 == 0 ||
             (pWVar11 == (WeightParams *)&Specification::_WeightParams_default_instance_)) ||
            (cVar16 = '\x03', pWVar11->quantization_ == (QuantizationParams *)0x0)))) {
          cVar16 = '\x05';
        }
      }
      if (cVar16 == '\x01') {
LAB_005387d7:
        bVar18 = false;
      }
      else {
        if (layer->_oneof_case_[0] == 0xa0) {
          LVar13 = layer->layer_;
        }
        else {
          LVar13.batchnorm_ = Specification::BatchnormLayerParams::default_instance();
        }
        pWVar11 = (LVar13.innerproduct_)->bias_;
        if (pWVar11 == (WeightParams *)0x0) {
          pWVar11 = (WeightParams *)&Specification::_WeightParams_default_instance_;
        }
        iVar2 = (pWVar11->floatvalue_).current_size_;
        sVar3 = ((pWVar11->float16value_).ptr_)->_M_string_length;
        uVar14 = (0 < iVar2) + 1;
        if (sVar3 == 0) {
          uVar14 = (uint)(0 < iVar2);
        }
        sVar4 = ((pWVar11->rawvalue_).ptr_)->_M_string_length;
        sVar5 = ((pWVar11->int8rawvalue_).ptr_)->_M_string_length;
        uVar8 = (uint)(sVar5 == 0);
        uVar14 = (uVar14 - (sVar4 == 0)) + 2;
        cVar16 = '\x04';
        if (uVar14 - uVar8 < 2) {
          cVar16 = '\x05';
          if (uVar14 != uVar8) {
            cVar16 = iVar2 < 1;
          }
          if (((((sVar3 == 0) && (iVar2 < 1)) && (uVar14 != uVar8)) &&
              (((sVar4 == 0 ||
                (pWVar11 == (WeightParams *)&Specification::_WeightParams_default_instance_)) ||
               (cVar16 = '\x02', pWVar11->quantization_ == (QuantizationParams *)0x0)))) &&
             (((sVar5 == 0 ||
               (pWVar11 == (WeightParams *)&Specification::_WeightParams_default_instance_)) ||
              (cVar16 = '\x03', pWVar11->quantization_ == (QuantizationParams *)0x0)))) {
            cVar16 = '\x05';
          }
        }
        if (cVar16 == '\x01') goto LAB_005387d7;
        if (layer->_oneof_case_[0] == 0xa0) {
          LVar13 = layer->layer_;
        }
        else {
          LVar13.batchnorm_ = Specification::BatchnormLayerParams::default_instance();
        }
        pWVar11 = (LVar13.batchnorm_)->mean_;
        if (pWVar11 == (WeightParams *)0x0) {
          pWVar11 = (WeightParams *)&Specification::_WeightParams_default_instance_;
        }
        iVar2 = (pWVar11->floatvalue_).current_size_;
        sVar3 = ((pWVar11->float16value_).ptr_)->_M_string_length;
        uVar14 = (0 < iVar2) + 1;
        if (sVar3 == 0) {
          uVar14 = (uint)(0 < iVar2);
        }
        sVar4 = ((pWVar11->rawvalue_).ptr_)->_M_string_length;
        sVar5 = ((pWVar11->int8rawvalue_).ptr_)->_M_string_length;
        uVar8 = (uint)(sVar5 == 0);
        uVar14 = (uVar14 - (sVar4 == 0)) + 2;
        cVar16 = '\x04';
        if (uVar14 - uVar8 < 2) {
          cVar16 = '\x05';
          if (uVar14 != uVar8) {
            cVar16 = iVar2 < 1;
          }
          if (((((sVar3 == 0) && (iVar2 < 1)) && (uVar14 != uVar8)) &&
              (((sVar4 == 0 ||
                (pWVar11 == (WeightParams *)&Specification::_WeightParams_default_instance_)) ||
               (cVar16 = '\x02', pWVar11->quantization_ == (QuantizationParams *)0x0)))) &&
             (((sVar5 == 0 ||
               (pWVar11 == (WeightParams *)&Specification::_WeightParams_default_instance_)) ||
              (cVar16 = '\x03', pWVar11->quantization_ == (QuantizationParams *)0x0)))) {
            cVar16 = '\x05';
          }
        }
        if (cVar16 == '\x01') goto LAB_005387d7;
        if (layer->_oneof_case_[0] == 0xa0) {
          LVar13 = layer->layer_;
        }
        else {
          LVar13.batchnorm_ = Specification::BatchnormLayerParams::default_instance();
        }
        pWVar11 = (LVar13.batchnorm_)->variance_;
        if (pWVar11 == (WeightParams *)0x0) {
          pWVar11 = (WeightParams *)&Specification::_WeightParams_default_instance_;
        }
        iVar2 = (pWVar11->floatvalue_).current_size_;
        sVar3 = ((pWVar11->float16value_).ptr_)->_M_string_length;
        uVar14 = (0 < iVar2) + 1;
        if (sVar3 == 0) {
          uVar14 = (uint)(0 < iVar2);
        }
        sVar4 = ((pWVar11->rawvalue_).ptr_)->_M_string_length;
        sVar5 = ((pWVar11->int8rawvalue_).ptr_)->_M_string_length;
        uVar8 = (uint)(sVar5 == 0);
        uVar14 = (uVar14 - (sVar4 == 0)) + 2;
        cVar16 = '\x04';
        if (uVar14 - uVar8 < 2) {
          cVar16 = '\x05';
          if (uVar14 != uVar8) {
            cVar16 = iVar2 < 1;
          }
          if (((((sVar3 == 0) && (iVar2 < 1)) && (uVar14 != uVar8)) &&
              (((sVar4 == 0 ||
                (pWVar11 == (WeightParams *)&Specification::_WeightParams_default_instance_)) ||
               (cVar16 = '\x02', pWVar11->quantization_ == (QuantizationParams *)0x0)))) &&
             (((sVar5 == 0 ||
               (pWVar11 == (WeightParams *)&Specification::_WeightParams_default_instance_)) ||
              (cVar16 = '\x03', pWVar11->quantization_ == (QuantizationParams *)0x0)))) {
            cVar16 = '\x05';
          }
        }
        bVar18 = cVar16 != '\x01';
      }
      if (layer->_oneof_case_[0] == 0xa0) {
        LVar13 = layer->layer_;
      }
      else {
        LVar13.batchnorm_ = Specification::BatchnormLayerParams::default_instance();
      }
      pWVar11 = (WeightParams *)((LVar13.activation_)->NonlinearityType_).relu_;
      if (pWVar11 == (WeightParams *)0x0) {
        pWVar11 = (WeightParams *)&Specification::_WeightParams_default_instance_;
      }
      bVar17 = 0 < (pWVar11->floatvalue_).current_size_;
      uVar14 = bVar17 + 1;
      if (((pWVar11->float16value_).ptr_)->_M_string_length == 0) {
        uVar14 = (uint)bVar17;
      }
      bVar17 = true;
      if (((uVar14 - (((pWVar11->rawvalue_).ptr_)->_M_string_length == 0)) + 2) -
          (uint)(((pWVar11->int8rawvalue_).ptr_)->_M_string_length == 0) < 2) {
        if (layer->_oneof_case_[0] == 0xa0) {
          LVar13 = layer->layer_;
        }
        else {
          LVar13.batchnorm_ = Specification::BatchnormLayerParams::default_instance();
        }
        pWVar11 = (LVar13.innerproduct_)->bias_;
        if (pWVar11 == (WeightParams *)0x0) {
          pWVar11 = (WeightParams *)&Specification::_WeightParams_default_instance_;
        }
        bVar7 = 0 < (pWVar11->floatvalue_).current_size_;
        uVar14 = bVar7 + 1;
        if (((pWVar11->float16value_).ptr_)->_M_string_length == 0) {
          uVar14 = (uint)bVar7;
        }
        if (((uVar14 - (((pWVar11->rawvalue_).ptr_)->_M_string_length == 0)) + 2) -
            (uint)(((pWVar11->int8rawvalue_).ptr_)->_M_string_length == 0) < 2) {
          if (layer->_oneof_case_[0] == 0xa0) {
            LVar13 = layer->layer_;
          }
          else {
            LVar13.batchnorm_ = Specification::BatchnormLayerParams::default_instance();
          }
          pWVar11 = (LVar13.batchnorm_)->mean_;
          if (pWVar11 == (WeightParams *)0x0) {
            pWVar11 = (WeightParams *)&Specification::_WeightParams_default_instance_;
          }
          bVar7 = 0 < (pWVar11->floatvalue_).current_size_;
          uVar14 = bVar7 + 1;
          if (((pWVar11->float16value_).ptr_)->_M_string_length == 0) {
            uVar14 = (uint)bVar7;
          }
          if (((uVar14 - (((pWVar11->rawvalue_).ptr_)->_M_string_length == 0)) + 2) -
              (uint)(((pWVar11->int8rawvalue_).ptr_)->_M_string_length == 0) < 2) {
            if (layer->_oneof_case_[0] == 0xa0) {
              LVar13 = layer->layer_;
            }
            else {
              LVar13.batchnorm_ = Specification::BatchnormLayerParams::default_instance();
            }
            pWVar11 = (LVar13.batchnorm_)->variance_;
            if (pWVar11 == (WeightParams *)0x0) {
              pWVar11 = (WeightParams *)&Specification::_WeightParams_default_instance_;
            }
            bVar17 = 0 < (pWVar11->floatvalue_).current_size_;
            uVar14 = bVar17 + 1;
            if (((pWVar11->float16value_).ptr_)->_M_string_length == 0) {
              uVar14 = (uint)bVar17;
            }
            bVar17 = 1 < ((uVar14 - (((pWVar11->rawvalue_).ptr_)->_M_string_length == 0)) + 2) -
                         (uint)(((pWVar11->int8rawvalue_).ptr_)->_M_string_length == 0);
          }
        }
      }
      if ((bVar17) || (!bVar9 && !bVar18)) {
        std::operator+(&local_e8,"Batchnorm layer \'",(layer->name_).ptr_);
        plVar12 = (long *)std::__cxx11::string::append((char *)&local_e8);
        local_a0 = (undefined1  [8])local_90;
        psVar15 = (size_type *)(plVar12 + 2);
        if ((size_type *)*plVar12 == psVar15) {
          local_90._0_8_ = *psVar15;
          local_90._8_8_ = plVar12[3];
        }
        else {
          local_90._0_8_ = *psVar15;
          local_a0 = (undefined1  [8])*plVar12;
        }
        local_98._M_p = (pointer)plVar12[1];
        *plVar12 = (long)psVar15;
        plVar12[1] = 0;
        *(undefined1 *)(plVar12 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
          operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
        }
        Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_a0);
LAB_00538d47:
        if (local_a0 != (undefined1  [8])local_90) {
          operator_delete((void *)local_a0,local_90._0_8_ + 1);
        }
        goto LAB_00538ee3;
      }
      if (layer->_oneof_case_[0] == 0xa0) {
        LVar13 = layer->layer_;
      }
      else {
        LVar13.batchnorm_ = Specification::BatchnormLayerParams::default_instance();
      }
      local_58 = (LVar13.batchnorm_)->channels_;
      if (layer->_oneof_case_[0] == 0xa0) {
        LVar13 = layer->layer_;
      }
      else {
        LVar13.batchnorm_ = Specification::BatchnormLayerParams::default_instance();
      }
      pWVar11 = (WeightParams *)((LVar13.activation_)->NonlinearityType_).linear_;
      if (pWVar11 == (WeightParams *)0x0) {
        pWVar11 = (WeightParams *)&Specification::_WeightParams_default_instance_;
      }
      local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"BatchNorm","");
      psVar6 = (layer->name_).ptr_;
      local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"gamma","");
      validateGeneralWeightParams((Result *)local_a0,pWVar11,local_58,1,&local_e8,psVar6,&local_78);
      local_c8 = (size_type *)local_a0;
      std::__cxx11::string::operator=((string *)&local_c0,(string *)&local_98);
      if (local_98._M_p != local_90 + 8) {
        operator_delete(local_98._M_p,local_90._8_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
        operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
      }
      bVar9 = Result::good((Result *)&local_c8);
      if (bVar9) {
        if (layer->_oneof_case_[0] == 0xa0) {
          LVar13 = layer->layer_;
        }
        else {
          LVar13.batchnorm_ = Specification::BatchnormLayerParams::default_instance();
        }
        pWVar11 = (LVar13.innerproduct_)->bias_;
        if (pWVar11 == (WeightParams *)0x0) {
          pWVar11 = (WeightParams *)&Specification::_WeightParams_default_instance_;
        }
        local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"BatchNorm","");
        psVar6 = (layer->name_).ptr_;
        local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"beta","");
        validateGeneralWeightParams
                  ((Result *)local_a0,pWVar11,local_58,1,&local_e8,psVar6,&local_78);
        local_c8 = (size_type *)local_a0;
        std::__cxx11::string::operator=((string *)&local_c0,(string *)&local_98);
        if (local_98._M_p != local_90 + 8) {
          operator_delete(local_98._M_p,local_90._8_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p != &local_78.field_2) {
          operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
          operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
        }
        bVar9 = Result::good((Result *)&local_c8);
        if (bVar9) {
          if (layer->_oneof_case_[0] == 0xa0) {
            LVar13 = layer->layer_;
          }
          else {
            LVar13.batchnorm_ = Specification::BatchnormLayerParams::default_instance();
          }
          if ((LVar13.batchnorm_)->computemeanvar_ == false) {
            if (layer->_oneof_case_[0] == 0xa0) {
              LVar13 = layer->layer_;
            }
            else {
              LVar13.batchnorm_ = Specification::BatchnormLayerParams::default_instance();
            }
            pWVar11 = (LVar13.batchnorm_)->mean_;
            if (pWVar11 == (WeightParams *)0x0) {
              pWVar11 = (WeightParams *)&Specification::_WeightParams_default_instance_;
            }
            WVar10 = valueType(pWVar11);
            if (WVar10 != EMPTY) {
              if (layer->_oneof_case_[0] == 0xa0) {
                LVar13 = layer->layer_;
              }
              else {
                LVar13.batchnorm_ = Specification::BatchnormLayerParams::default_instance();
              }
              pWVar11 = (LVar13.batchnorm_)->mean_;
              if (pWVar11 == (WeightParams *)0x0) {
                pWVar11 = (WeightParams *)&Specification::_WeightParams_default_instance_;
              }
              WVar10 = valueType(pWVar11);
              if (WVar10 != EMPTY) {
                if (layer->_oneof_case_[0] == 0xa0) {
                  LVar13 = layer->layer_;
                }
                else {
                  LVar13.batchnorm_ = Specification::BatchnormLayerParams::default_instance();
                }
                pWVar11 = (LVar13.batchnorm_)->mean_;
                if (pWVar11 == (WeightParams *)0x0) {
                  pWVar11 = (WeightParams *)&Specification::_WeightParams_default_instance_;
                }
                local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"BatchNorm","");
                psVar6 = (layer->name_).ptr_;
                local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"mean","");
                validateGeneralWeightParams
                          ((Result *)local_a0,pWVar11,local_58,1,&local_e8,psVar6,&local_78);
                local_c8 = (size_type *)local_a0;
                std::__cxx11::string::operator=((string *)&local_c0,(string *)&local_98);
                if (local_98._M_p != local_90 + 8) {
                  operator_delete(local_98._M_p,local_90._8_8_ + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_78._M_dataplus._M_p != &local_78.field_2) {
                  operator_delete(local_78._M_dataplus._M_p,
                                  local_78.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
                  operator_delete(local_e8._M_dataplus._M_p,
                                  local_e8.field_2._M_allocated_capacity + 1);
                }
                bVar9 = Result::good((Result *)&local_c8);
                if (bVar9) {
                  if (layer->_oneof_case_[0] == 0xa0) {
                    LVar13 = layer->layer_;
                  }
                  else {
                    LVar13.batchnorm_ = Specification::BatchnormLayerParams::default_instance();
                  }
                  pWVar11 = (LVar13.batchnorm_)->variance_;
                  if (pWVar11 == (WeightParams *)0x0) {
                    pWVar11 = (WeightParams *)&Specification::_WeightParams_default_instance_;
                  }
                  local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_e8,"BatchNorm","");
                  psVar6 = (layer->name_).ptr_;
                  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
                  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"variance","")
                  ;
                  validateGeneralWeightParams
                            ((Result *)local_a0,pWVar11,local_58,1,&local_e8,psVar6,&local_78);
                  local_c8 = (size_type *)local_a0;
                  std::__cxx11::string::operator=((string *)&local_c0,(string *)&local_98);
                  if (local_98._M_p != local_90 + 8) {
                    operator_delete(local_98._M_p,local_90._8_8_ + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_78._M_dataplus._M_p != &local_78.field_2) {
                    operator_delete(local_78._M_dataplus._M_p,
                                    local_78.field_2._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
                    operator_delete(local_e8._M_dataplus._M_p,
                                    local_e8.field_2._M_allocated_capacity + 1);
                  }
                  Result::good((Result *)&local_c8);
                }
                goto LAB_00538e95;
              }
            }
            std::operator+(&local_e8,"Batchnorm layer \'",(layer->name_).ptr_);
            plVar12 = (long *)std::__cxx11::string::append((char *)&local_e8);
            local_a0 = (undefined1  [8])local_90;
            psVar15 = (size_type *)(plVar12 + 2);
            if ((size_type *)*plVar12 == psVar15) {
              local_90._0_8_ = *psVar15;
              local_90._8_8_ = plVar12[3];
            }
            else {
              local_90._0_8_ = *psVar15;
              local_a0 = (undefined1  [8])*plVar12;
            }
            local_98._M_p = (pointer)plVar12[1];
            *plVar12 = (long)psVar15;
            plVar12[1] = 0;
            *(undefined1 *)(plVar12 + 2) = 0;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
              operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
            }
            Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_a0);
            goto LAB_00538d47;
          }
        }
      }
    }
  }
LAB_00538e95:
  *(size_type **)__return_storage_ptr__ = local_c8;
  paVar1 = &(__return_storage_ptr__->m_message).field_2;
  (__return_storage_ptr__->m_message)._M_dataplus._M_p = (pointer)paVar1;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_p == &local_b0) {
    paVar1->_M_allocated_capacity =
         CONCAT71(local_b0._M_allocated_capacity._1_7_,local_b0._M_local_buf[0]);
    *(undefined8 *)((long)&(__return_storage_ptr__->m_message).field_2 + 8) = local_b0._8_8_;
  }
  else {
    (__return_storage_ptr__->m_message)._M_dataplus._M_p = local_c0._M_p;
    (__return_storage_ptr__->m_message).field_2._M_allocated_capacity =
         CONCAT71(local_b0._M_allocated_capacity._1_7_,local_b0._M_local_buf[0]);
  }
  (__return_storage_ptr__->m_message)._M_string_length = local_b8;
  local_b8 = 0;
  local_b0._M_local_buf[0] = '\0';
  local_c0._M_p = (pointer)&local_b0;
LAB_00538ee3:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_p != &local_b0) {
    operator_delete(local_c0._M_p,
                    CONCAT71(local_b0._M_allocated_capacity._1_7_,local_b0._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateBatchnormLayer(const Specification::NeuralNetworkLayer& layer) {

    Result r;
    r = validateInputCount(layer, 1, 1);
    if (r.good()) {
        r = validateOutputCount(layer, 1, 1);
    }

    if (!r.good()){ return r;}
    if (ndArrayInterpretation) {
        r = validateInputOutputRankEquality(layer, "Batchnorm", blobNameToRank);
        if (!r.good()) {return r;}
        r = validateRankCount(layer, "Batchnorm", 3, -1, blobNameToRank);
        if (!r.good()) {return r;}
    }

    // Check parameters types
    bool has_f32_params = ((valueType(layer.batchnorm().gamma()) == FLOAT32) || (valueType(layer.batchnorm().beta()) == FLOAT32) ||
                           (valueType(layer.batchnorm().mean()) == FLOAT32)  || (valueType(layer.batchnorm().variance()) == FLOAT32));
    bool has_f16_params = ((valueType(layer.batchnorm().gamma()) == FLOAT16) || (valueType(layer.batchnorm().beta()) == FLOAT16) ||
                           (valueType(layer.batchnorm().mean()) == FLOAT16)  || (valueType(layer.batchnorm().variance()) == FLOAT16));
    bool invalid_params = ((valueType(layer.batchnorm().gamma()) == UNSPECIFIED) || (valueType(layer.batchnorm().beta()) == UNSPECIFIED) ||
                           (valueType(layer.batchnorm().mean()) == UNSPECIFIED)  || (valueType(layer.batchnorm().variance()) == UNSPECIFIED));
    if ((has_f32_params && has_f16_params) || invalid_params) {
        std::string err = "Batchnorm layer '" + layer.name() + "' parameters have values for both full and half precision. Parameters "
        "should either be specified in half or full precision, mixed parameters are not supported.";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }

    // Check parameters length
    uint64_t num_channels = static_cast<uint64_t>(layer.batchnorm().channels());
    r = validateGeneralWeightParams(layer.batchnorm().gamma(), num_channels, 1, "BatchNorm", layer.name(), "gamma");
    if (!r.good()) return r;
    r = validateGeneralWeightParams(layer.batchnorm().beta(), num_channels, 1, "BatchNorm", layer.name(), "beta");
    if (!r.good()) return r;
    // Check existence of mean / variance
    if (!layer.batchnorm().computemeanvar()) {
        if (valueType(layer.batchnorm().mean()) == EMPTY || valueType(layer.batchnorm().mean()) == EMPTY){
            const std::string err = "Batchnorm layer '" + layer.name() + "' is missing mean and variance.";
            return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        }
        r = validateGeneralWeightParams(layer.batchnorm().mean(), num_channels, 1, "BatchNorm", layer.name(), "mean");
        if (!r.good()) return r;
        r = validateGeneralWeightParams(layer.batchnorm().variance(), num_channels, 1, "BatchNorm", layer.name(), "variance");
        if (!r.good()) return r;
    }
    return r;
}